

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::Tags::ExpandTagsArray(Tags *this)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  Tag *pTVar6;
  long lVar7;
  
  iVar1 = this->m_tags_size;
  if (this->m_tags_count < iVar1) {
    return true;
  }
  iVar4 = 1;
  if (iVar1 != 0) {
    iVar4 = iVar1 * 2;
  }
  lVar3 = (long)iVar4 * 0x10;
  uVar5 = 0xffffffffffffffff;
  if (-1 < iVar4) {
    uVar5 = lVar3 + 8;
  }
  plVar2 = (long *)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
  if (plVar2 == (long *)0x0) {
    return false;
  }
  *plVar2 = (long)iVar4;
  lVar7 = 0;
  pTVar6 = (Tag *)(plVar2 + 1);
  do {
    Tag::Tag(pTVar6);
    lVar7 = lVar7 + -0x10;
    pTVar6 = pTVar6 + 1;
  } while (-lVar7 != lVar3);
  iVar1 = this->m_tags_count;
  pTVar6 = this->m_tags;
  if ((long)iVar1 < 1) {
    if (pTVar6 == (Tag *)0x0) goto LAB_00158c3f;
  }
  else {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)plVar2 + lVar3 + 8) =
           *(undefined8 *)((long)&pTVar6->m_simple_tags + lVar3);
      *(undefined8 *)((long)plVar2 + lVar3 + 0x10) =
           *(undefined8 *)((long)&pTVar6->m_simple_tags_size + lVar3);
      lVar3 = lVar3 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar3);
  }
  lVar3._0_4_ = pTVar6[-1].m_simple_tags_size;
  lVar3._4_4_ = pTVar6[-1].m_simple_tags_count;
  if (lVar3 != 0) {
    lVar3 = lVar3 << 4;
    do {
      Tag::~Tag((Tag *)((long)&pTVar6[-1].m_simple_tags + lVar3));
      lVar3 = lVar3 + -0x10;
    } while (lVar3 != 0);
  }
  operator_delete__(&pTVar6[-1].m_simple_tags_size);
LAB_00158c3f:
  this->m_tags = (Tag *)(plVar2 + 1);
  this->m_tags_size = iVar4;
  return true;
}

Assistant:

bool Tags::ExpandTagsArray() {
  if (m_tags_size > m_tags_count)
    return true;  // nothing else to do

  const int size = (m_tags_size == 0) ? 1 : 2 * m_tags_size;

  Tag* const tags = new (std::nothrow) Tag[size];

  if (tags == NULL)
    return false;

  for (int idx = 0; idx < m_tags_count; ++idx) {
    m_tags[idx].ShallowCopy(tags[idx]);
  }

  delete[] m_tags;
  m_tags = tags;

  m_tags_size = size;
  return true;
}